

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::objectivec::ParseSimpleFile
               (string *path,LineConsumer *line_consumer,string *out_error)

{
  FileInputStream *this;
  uint uVar1;
  char *pcVar2;
  int *piVar3;
  int i;
  bool bVar4;
  string local_2a8;
  string local_288;
  allocator local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  StringPiece local_1a0;
  int local_18c;
  char *pcStack_188;
  int buf_len;
  void *buf;
  Parser parser;
  FileInputStream file_stream;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_2c;
  string *psStack_28;
  int fd;
  string *out_error_local;
  LineConsumer *line_consumer_local;
  string *path_local;
  
  psStack_28 = out_error;
  out_error_local = (string *)line_consumer;
  line_consumer_local = (LineConsumer *)path;
  do {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    local_2c = open(pcVar2,0);
    bVar4 = false;
    if (local_2c < 0) {
      piVar3 = __errno_location();
      bVar4 = *piVar3 == 4;
    }
  } while (bVar4);
  if (local_2c < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b0,"error: Unable to open \"",&local_b1);
    std::operator+(&local_90,&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   line_consumer_local);
    std::operator+(&local_70,&local_90,"\", ");
    piVar3 = __errno_location();
    pcVar2 = strerror(*piVar3);
    std::operator+(&local_50,&local_70,pcVar2);
    std::__cxx11::string::operator=((string *)psStack_28,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    path_local._7_1_ = 0;
  }
  else {
    this = (FileInputStream *)((long)&parser.leftover_.field_2 + 8);
    io::FileInputStream::FileInputStream(this,local_2c,-1);
    io::FileInputStream::SetCloseOnDelete(this,true);
    anon_unknown_0::Parser::Parser((Parser *)&buf,(LineConsumer *)out_error_local);
    do {
      do {
        bVar4 = io::FileInputStream::Next
                          ((FileInputStream *)((long)&parser.leftover_.field_2 + 8),
                           &stack0xfffffffffffffe78,&local_18c);
        if (!bVar4) {
          path_local._7_1_ = anon_unknown_0::Parser::Finish((Parser *)&buf);
          goto LAB_003b2c43;
        }
      } while (local_18c == 0);
      StringPiece::StringPiece(&local_1a0,pcStack_188,(long)local_18c);
      bVar4 = anon_unknown_0::Parser::ParseChunk((Parser *)&buf,local_1a0);
    } while (((bVar4 ^ 0xffU) & 1) == 0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_260,"error: ",&local_261);
    std::operator+(&local_240,&local_260,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   line_consumer_local);
    std::operator+(&local_220,&local_240," Line ");
    uVar1 = anon_unknown_0::Parser::last_line((Parser *)&buf);
    SimpleItoa_abi_cxx11_(&local_288,(protobuf *)(ulong)uVar1,i);
    std::operator+(&local_200,&local_220,&local_288);
    std::operator+(&local_1e0,&local_200,", ");
    (anonymous_namespace)::Parser::error_str_abi_cxx11_(&local_2a8,&buf);
    std::operator+(&local_1c0,&local_1e0,&local_2a8);
    std::__cxx11::string::operator=((string *)psStack_28,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
    path_local._7_1_ = false;
LAB_003b2c43:
    anon_unknown_0::Parser::~Parser((Parser *)&buf);
    io::FileInputStream::~FileInputStream((FileInputStream *)((long)&parser.leftover_.field_2 + 8));
  }
  return (bool)(path_local._7_1_ & 1);
}

Assistant:

bool ParseSimpleFile(
    const string& path, LineConsumer* line_consumer, string* out_error) {
  int fd;
  do {
    fd = open(path.c_str(), O_RDONLY);
  } while (fd < 0 && errno == EINTR);
  if (fd < 0) {
    *out_error =
        string("error: Unable to open \"") + path + "\", " + strerror(errno);
    return false;
  }
  io::FileInputStream file_stream(fd);
  file_stream.SetCloseOnDelete(true);

  Parser parser(line_consumer);
  const void* buf;
  int buf_len;
  while (file_stream.Next(&buf, &buf_len)) {
    if (buf_len == 0) {
      continue;
    }

    if (!parser.ParseChunk(StringPiece(static_cast<const char*>(buf), buf_len))) {
      *out_error =
          string("error: ") + path +
          " Line " + SimpleItoa(parser.last_line()) + ", " + parser.error_str();
      return false;
    }
  }
  return parser.Finish();
}